

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Eventregister.cpp
# Opt level: O0

bool __thiscall EventRegister::has(EventRegister *this,string *event)

{
  bool bVar1;
  _Self local_28;
  _Self local_20;
  string *local_18;
  string *event_local;
  EventRegister *this_local;
  
  local_18 = event;
  event_local = (string *)this;
  toLower(event);
  local_20._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Event,_std::default_delete<Event>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Event,_std::default_delete<Event>_>_>_>_>
       ::find(&this->m_events,event);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Event,_std::default_delete<Event>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Event,_std::default_delete<Event>_>_>_>_>
       ::end(&this->m_events);
  bVar1 = std::operator!=(&local_20,&local_28);
  return bVar1;
}

Assistant:

bool EventRegister::has(std::string event)
{
    toLower(event);
    return m_events.find(event) != m_events.end();
}